

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

ssize_t http_decode_path(char *dest,char *url_data,size_t length)

{
  int iVar1;
  char *end;
  char *pos;
  size_t length_local;
  char *url_data_local;
  char *dest_local;
  
  end = dest;
  length_local = (size_t)url_data;
  do {
    if (url_data + length <= length_local) {
      *end = '\0';
      return (ssize_t)(end + -(long)dest);
    }
    if (*(char *)length_local == '%') {
      iVar1 = hex2byte((uint8_t *)end,(uint8_t *)(length_local + 1));
      if (iVar1 != 0) {
        return -1;
      }
      length_local = length_local + 3;
    }
    else {
      *end = *(char *)length_local;
      length_local = length_local + 1;
    }
    end = end + 1;
  } while( true );
}

Assistant:

ssize_t http_decode_path(char *dest, const char *url_data, size_t length) {
  char *pos = dest;
  const char *end = url_data + length;
  while (url_data < end) {
    if (*url_data == '%') {
      // decode hex value
      // this is a percent encoded value.
      if (hex2byte((uint8_t *)pos, (uint8_t *)&url_data[1]))
        return -1;
      pos++;
      url_data += 3;
    } else
      *(pos++) = *(url_data++);
  }
  *pos = 0;
  return pos - dest;
}